

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O0

Index __thiscall
MultiAgentDecisionProcess::GetAgentIndexByName(MultiAgentDecisionProcess *this,string *s)

{
  bool bVar1;
  __type_conflict _Var2;
  reference pAVar3;
  ostream *poVar4;
  undefined8 uVar5;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  stringstream ss;
  string s2;
  const_iterator it;
  NamedDescribedEntity *in_stack_fffffffffffffdb8;
  __normal_iterator<const_Agent_*,_std::vector<Agent,_std::allocator<Agent>_>_>
  *in_stack_fffffffffffffdc0;
  __normal_iterator<const_Agent_*,_std::vector<Agent,_std::allocator<Agent>_>_>
  *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd8;
  Index in_stack_fffffffffffffddc;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 uVar6;
  E *in_stack_fffffffffffffdf0;
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  Agent *local_68;
  uint local_60;
  string local_50 [32];
  Agent *local_30;
  Agent *local_28;
  __normal_iterator<const_Agent_*,_std::vector<Agent,_std::allocator<Agent>_>_> local_20;
  string *local_18;
  Index local_4;
  
  local_18 = in_RSI;
  __gnu_cxx::__normal_iterator<const_Agent_*,_std::vector<Agent,_std::allocator<Agent>_>_>::
  __normal_iterator(&local_20);
  local_28 = (Agent *)std::vector<Agent,_std::allocator<Agent>_>::begin
                                ((vector<Agent,_std::allocator<Agent>_> *)in_stack_fffffffffffffdb8)
  ;
  local_20._M_current = local_28;
  while( true ) {
    local_30 = (Agent *)std::vector<Agent,_std::allocator<Agent>_>::end
                                  ((vector<Agent,_std::allocator<Agent>_> *)
                                   in_stack_fffffffffffffdb8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffdc0,
                       (__normal_iterator<const_Agent_*,_std::vector<Agent,_std::allocator<Agent>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1f0);
      poVar4 = std::operator<<(local_1e0,"GetAgentIndexByName - agent \"");
      poVar4 = std::operator<<(poVar4,local_18);
      poVar4 = std::operator<<(poVar4," not found.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      uVar6 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      E::E(in_stack_fffffffffffffdf0,(char *)CONCAT17(uVar6,in_stack_fffffffffffffde8));
      __cxa_throw(uVar5,&E::typeinfo,E::~E);
    }
    __gnu_cxx::__normal_iterator<const_Agent_*,_std::vector<Agent,_std::allocator<Agent>_>_>::
    operator*(&local_20);
    NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffffdb8);
    _Var2 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))
    ;
    if (_Var2) {
      pAVar3 = __gnu_cxx::
               __normal_iterator<const_Agent_*,_std::vector<Agent,_std::allocator<Agent>_>_>::
               operator*(&local_20);
      in_stack_fffffffffffffddc = DiscreteEntity::GetIndex(&pAVar3->super_DiscreteEntity);
      local_4 = in_stack_fffffffffffffddc;
    }
    local_60 = (uint)_Var2;
    std::__cxx11::string::~string(local_50);
    if (local_60 != 0) break;
    local_68 = (Agent *)__gnu_cxx::
                        __normal_iterator<const_Agent_*,_std::vector<Agent,_std::allocator<Agent>_>_>
                        ::operator++(in_stack_fffffffffffffdc8,
                                     (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
  }
  return local_4;
}

Assistant:

Index MultiAgentDecisionProcess::GetAgentIndexByName(const string &s) const	       
{
    vector<Agent>::const_iterator it;
    for(it = _m_agents.begin(); it != _m_agents.end(); it++)
    {
        string s2 = (*it).GetName();
        if(s == s2)
            return( (*it).GetIndex() );
    }
    //not found
    stringstream ss;
    ss << "GetAgentIndexByName - agent \"" << s << " not found." << endl;
    throw E(ss.str().c_str());
}